

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.h
# Opt level: O0

void __thiscall
RegVmLoweredFunction::RegVmLoweredFunction
          (RegVmLoweredFunction *this,Allocator *allocator,RegVmLoweredModule *parent,
          VmFunction *vmFunction)

{
  unsigned_short local_36 [7];
  VmFunction *local_28;
  VmFunction *vmFunction_local;
  RegVmLoweredModule *parent_local;
  Allocator *allocator_local;
  RegVmLoweredFunction *this_local;
  
  this->parent = parent;
  this->vmFunction = vmFunction;
  local_28 = vmFunction;
  vmFunction_local = (VmFunction *)parent;
  parent_local = (RegVmLoweredModule *)allocator;
  allocator_local = (Allocator *)this;
  SmallArray<RegVmLoweredBlock_*,_16U>::SmallArray(&this->blocks,allocator);
  SmallArray<unsigned_char,_16U>::SmallArray(&this->delayedFreedRegisters,(Allocator *)parent_local)
  ;
  SmallArray<unsigned_char,_16U>::SmallArray(&this->freedRegisters,(Allocator *)parent_local);
  SmallArray<unsigned_char,_16U>::SmallArray(&this->constantRegisters,(Allocator *)parent_local);
  SmallArray<unsigned_char,_16U>::SmallArray(&this->killedRegisters,(Allocator *)parent_local);
  SmallArray<VmInstruction_*,_16U>::SmallArray(&this->colorRegisters,(Allocator *)parent_local);
  local_36[0] = 0;
  FixedArray<unsigned_short,_256U>::fill(&this->registerUsers,local_36);
  this->nextRegister = '\x04';
  this->hasRegisterOverflow = false;
  this->registerOverflowLocation = (VmInstruction *)0x0;
  return;
}

Assistant:

RegVmLoweredFunction(Allocator *allocator, RegVmLoweredModule *parent, VmFunction *vmFunction): parent(parent), vmFunction(vmFunction), blocks(allocator), delayedFreedRegisters(allocator), freedRegisters(allocator), constantRegisters(allocator), killedRegisters(allocator), colorRegisters(allocator)
	{
		registerUsers.fill(0);

		nextRegister = rvrrCount;

		hasRegisterOverflow = false;
		registerOverflowLocation = NULL;
	}